

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvParticle_dns.c
# Opt level: O2

void InputHelp(void)

{
  puts("\nCommand line options:");
  puts("  --alpha <vel>      : particle velocity");
  puts("  --orbits <orbits>  : number of orbits to perform");
  puts("  --rtol <rtol>      : relative tolerance");
  puts("  --atol <atol>      : absoltue tolerance");
  puts("  --proj <1 or 0>    : enable (1) / disable (0) projection");
  puts("  --projerr <1 or 0> : enable (1) / disable (0) error projection");
  puts("  --nout <nout>      : outputs per period");
  puts("  --tstop            : stop at output time (do not interpolate)");
  return;
}

Assistant:

static void InputHelp(void)
{
  printf("\nCommand line options:\n");
  printf("  --alpha <vel>      : particle velocity\n");
  printf("  --orbits <orbits>  : number of orbits to perform\n");
  printf("  --rtol <rtol>      : relative tolerance\n");
  printf("  --atol <atol>      : absoltue tolerance\n");
  printf("  --proj <1 or 0>    : enable (1) / disable (0) projection\n");
  printf("  --projerr <1 or 0> : enable (1) / disable (0) error projection\n");
  printf("  --nout <nout>      : outputs per period\n");
  printf("  --tstop            : stop at output time (do not interpolate)\n");
  return;
}